

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int skipcomment(LoadF *lf,int *cp)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  lf->n = 0;
  lVar3 = 0;
  do {
    uVar1 = getc((FILE *)lf->f);
    if ((uVar1 == 0xffffffff) || (uVar1 != (byte)anon_var_dwarf_5864[lVar3])) goto LAB_0010a6e0;
    lVar3 = lVar3 + 1;
    iVar2 = lf->n;
    lf->n = iVar2 + 1;
    lf->buff[iVar2] = (char)uVar1;
  } while (lVar3 != 3);
  lf->n = 0;
  uVar1 = getc((FILE *)lf->f);
LAB_0010a6e0:
  *cp = uVar1;
  iVar2 = 0;
  if (uVar1 == 0x23) {
    do {
      iVar2 = getc((FILE *)lf->f);
      if (iVar2 == 10) break;
    } while (iVar2 != -1);
    iVar2 = getc((FILE *)lf->f);
    *cp = iVar2;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int skipcomment(LoadF *lf, int *cp) {
    int c = *cp = skipBOM(lf);
    if (c == '#') {  /* first line is a comment (Unix exec. file)? */
        do {  /* skip first line */
            c = getc(lf->f);
        } while (c != EOF && c != '\n');
        *cp = getc(lf->f);  /* skip end-of-line, if present */
        return 1;  /* there was a comment */
    } else return 0;  /* no comment */
}